

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_dictionary_message.cpp
# Opt level: O0

FieldDef * __thiscall
bidfx_public_api::price::pixie::DataDictionaryMessage::ReadFieldDef
          (FieldDef *__return_storage_ptr__,DataDictionaryMessage *this,ByteBuffer *buffer)

{
  FieldTypeEnum type;
  FieldEncodingEnum encoding_00;
  uint32_t fid_00;
  uint uVar1;
  InputStream *stream;
  string local_70;
  undefined1 local_50 [8];
  string name;
  int scale;
  FieldEncodingEnum encoding;
  FieldTypeEnum field_type;
  int fid;
  ByteBuffer *buffer_local;
  DataDictionaryMessage *this_local;
  
  fid_00 = tools::Varint::ReadU32(&buffer->super_InputStream);
  uVar1 = (**(buffer->super_InputStream)._vptr_InputStream)();
  type = FieldTypeMethods::ValueOf(uVar1 & 0xff);
  uVar1 = (**(buffer->super_InputStream)._vptr_InputStream)();
  encoding_00 = FieldEncodingMethods::ValueOf(uVar1 & 0xff);
  name.field_2._12_4_ = tools::Varint::ReadU32(&buffer->super_InputStream);
  tools::Varint::ReadString_abi_cxx11_((string *)local_50,(Varint *)buffer,stream);
  std::__cxx11::string::string((string *)&local_70,(string *)local_50);
  FieldDef::FieldDef(__return_storage_ptr__,fid_00,type,&local_70,encoding_00,name.field_2._12_4_);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

FieldDef DataDictionaryMessage::ReadFieldDef(ByteBuffer& buffer)
{
    int fid = Varint::ReadU32(buffer);
    FieldTypeEnum field_type = FieldTypeMethods::ValueOf(buffer.ReadByte());
    FieldEncodingEnum encoding = FieldEncodingMethods::ValueOf(buffer.ReadByte());
    int scale =  Varint::ReadU32(buffer);
    std::string name = Varint::ReadString(buffer);

    return FieldDef(fid, field_type, name, encoding, scale);
}